

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_rc_update_rate_correction_factors(AV1_COMP *cpi,int is_encode_stage,int width,int height)

{
  AQ_MODE AVar1;
  aom_enc_pass aVar2;
  CYCLIC_REFRESH *pCVar3;
  AV1_PRIMARY *pAVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  
  dVar14 = get_rate_correction_factor(cpi,width,height);
  AVar1 = (cpi->oxcf).q_cfg.aq_mode;
  if (AVar1 == '\x03') {
    bVar10 = (cpi->common).seg.enabled != '\0';
  }
  else {
    bVar10 = false;
  }
  if ((cpi->rc).is_src_frame_alt_ref != 0) {
    return;
  }
  if (((((AVar1 == '\x03') && ((cpi->sf).rt_sf.overshoot_detection_cbr == '\x01')) &&
       ((cpi->rc).high_source_sad != 0)) &&
      ((cpi->cyclic_refresh->counter_encode_maxq_scene_change == 0 &&
       (((cpi->common).current_frame.frame_type & 0xfd) != 0)))) && (cpi->ppi->use_svc == 0)) {
    iVar7 = (cpi->common).quant_params.base_qindex;
    (cpi->rc).q_2_frame = iVar7;
    (cpi->rc).q_1_frame = iVar7;
    (cpi->rc).rc_1_frame = 0;
    (cpi->rc).rc_2_frame = 0;
    return;
  }
  if (bVar10) {
    iVar7 = av1_cyclic_refresh_estimate_bits_at_q(cpi,dVar14);
  }
  else {
    iVar7 = (cpi->common).mi_params.MBs;
    iVar8 = av1_rc_bits_per_mb(cpi,(cpi->common).current_frame.frame_type,
                               (cpi->common).quant_params.base_qindex,dVar14,
                               (cpi->sf).hl_sf.accurate_bit_estimate);
    iVar8 = iVar8 * iVar7 >> 9;
    iVar7 = 200;
    if (200 < iVar8) {
      iVar7 = iVar8;
    }
  }
  if (iVar7 < 0xc9) {
    dVar5 = 1.0;
  }
  else {
    dVar5 = (double)(cpi->rc).projected_frame_size / (double)iVar7;
  }
  if (dVar5 <= 0.25) {
    dVar5 = 0.25;
  }
  (cpi->rc).q_2_frame = (cpi->rc).q_1_frame;
  (cpi->rc).q_1_frame = (cpi->common).quant_params.base_qindex;
  uVar9 = 0xffffffff;
  if (dVar5 <= 1.1) {
    uVar9 = (uint)(dVar5 < 0.9);
  }
  (cpi->rc).rc_2_frame = (cpi->rc).rc_1_frame;
  (cpi->rc).rc_1_frame = uVar9;
  iVar7 = cpi->is_screen_content_type;
  dVar6 = log10(dVar5);
  uVar11 = 0;
  uVar12 = 0x3fe00000;
  if (iVar7 == 0) {
    if (ABS(dVar6) <= 0.5) {
      dVar6 = log10(dVar5);
      uVar11 = SUB84(ABS(dVar6),0);
      uVar12 = (undefined4)((ulong)ABS(dVar6) >> 0x20);
    }
    dVar6 = (double)CONCAT44(uVar12,uVar11) * 0.75;
  }
  else {
    if (ABS(dVar6) <= 0.5) {
      dVar6 = log10(dVar5);
      uVar11 = SUB84(ABS(dVar6),0);
      uVar12 = (undefined4)((ulong)ABS(dVar6) >> 0x20);
    }
    dVar6 = (double)CONCAT44(uVar12,uVar11) * 0.5;
  }
  if ((bVar10) && (0 < (cpi->rc).this_frame_target)) {
    pCVar3 = cpi->cyclic_refresh;
    if (dVar5 <= 1.25) {
      if (0.5 <= dVar5) goto LAB_00205efa;
      iVar7 = 5;
      if (pCVar3->percent_refresh_adjustment < 4) {
        iVar7 = pCVar3->percent_refresh_adjustment + 1;
      }
      pCVar3->percent_refresh_adjustment = iVar7;
      dVar13 = pCVar3->rate_ratio_qdelta_adjustment + 0.05;
      if (0.25 <= dVar13) {
        dVar13 = 0.25;
      }
    }
    else {
      iVar7 = -5;
      if (-4 < pCVar3->percent_refresh_adjustment) {
        iVar7 = pCVar3->percent_refresh_adjustment + -1;
      }
      pCVar3->percent_refresh_adjustment = iVar7;
      dVar13 = pCVar3->rate_ratio_qdelta_adjustment + -0.05;
      if (dVar13 <= -0.0) {
        dVar13 = -0.0;
      }
    }
    pCVar3->rate_ratio_qdelta_adjustment = dVar13;
  }
LAB_00205efa:
  if (dVar5 <= 1.01) {
    if ((dVar5 < 0.99) &&
       (dVar14 = dVar14 * (1.0 / ((1.0 / dVar5 + -1.0) * (dVar6 + 0.25) + 1.0)), dVar14 < 0.005)) {
      dVar14 = 0.005;
    }
  }
  else {
    dVar14 = dVar14 * ((dVar5 + -1.0) * (dVar6 + 0.25) + 1.0);
    if (50.0 < dVar14) {
      dVar14 = 50.0;
    }
  }
  pAVar4 = cpi->ppi;
  dVar14 = dVar14 / ((double)((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width) /
                    (double)(height * width));
  dVar5 = 50.0;
  if (dVar14 <= 50.0) {
    dVar5 = dVar14;
  }
  dVar14 = (double)(-(ulong)(dVar14 < 0.005) & 0x3f747ae147ae147b |
                   ~-(ulong)(dVar14 < 0.005) & (ulong)dVar5);
  if ((cpi->common).current_frame.frame_type == '\0') {
    (pAVar4->p_rc).rate_correction_factors[3] = dVar14;
  }
  else {
    aVar2 = (cpi->oxcf).pass;
    if ((aVar2 < AOM_RC_LAST_PASS) &&
       (((aVar2 != AOM_RC_ONE_PASS || (cpi->compressor_stage != '\0')) || (pAVar4->lap_enabled == 0)
        ))) {
      if (((((cpi->refresh_frame).alt_ref_frame == false) &&
           ((cpi->refresh_frame).golden_frame != true)) ||
          (((cpi->rc).is_src_frame_alt_ref != 0 || (pAVar4->use_svc != 0)))) ||
         (((cpi->oxcf).rc_cfg.mode == AOM_CBR && ((cpi->oxcf).rc_cfg.gf_cbr_boost_pct < 0x15)))) {
        if ((is_encode_stage == 0) ||
           ((pAVar4->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1)) {
          (pAVar4->p_rc).rate_correction_factors[0] = dVar14;
        }
        else {
          (cpi->rc).frame_level_rate_correction_factors[0] = dVar14;
        }
      }
      else {
        (pAVar4->p_rc).rate_correction_factors[2] = dVar14;
      }
    }
    else if ((is_encode_stage == 0) ||
            ((pAVar4->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1)) {
      (pAVar4->p_rc).rate_correction_factors
      ["\x03"[(pAVar4->gf_group).update_type[cpi->gf_frame_index]]] = dVar14;
    }
    else {
      (cpi->rc).frame_level_rate_correction_factors
      ["\x03"[(pAVar4->gf_group).update_type[cpi->gf_frame_index]]] = dVar14;
    }
  }
  return;
}

Assistant:

void av1_rc_update_rate_correction_factors(AV1_COMP *cpi, int is_encode_stage,
                                           int width, int height) {
  const AV1_COMMON *const cm = &cpi->common;
  double correction_factor = 1.0;
  double rate_correction_factor =
      get_rate_correction_factor(cpi, width, height);
  double adjustment_limit;
  int projected_size_based_on_q = 0;
  int cyclic_refresh_active =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cpi->common.seg.enabled;

  // Do not update the rate factors for arf overlay frames.
  if (cpi->rc.is_src_frame_alt_ref) return;

  // Don't update rate correction factors here on scene changes as
  // it is already reset in av1_encodedframe_overshoot_cbr(),
  // but reset variables related to previous frame q and size.
  // Note that the counter of frames since the last scene change
  // is only valid when cyclic refresh mode is enabled and that
  // this break out only applies to scene changes that are not
  // recorded as INTRA only key frames.
  // Note that av1_encodedframe_overshoot_cbr() is only entered
  // if cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ
  // and cpi->rc.high_source_sad = 1.
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ) &&
      (cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ) &&
      cpi->rc.high_source_sad &&
      (cpi->cyclic_refresh->counter_encode_maxq_scene_change == 0) &&
      !frame_is_intra_only(cm) && !cpi->ppi->use_svc) {
    cpi->rc.q_2_frame = cm->quant_params.base_qindex;
    cpi->rc.q_1_frame = cm->quant_params.base_qindex;
    cpi->rc.rc_2_frame = 0;
    cpi->rc.rc_1_frame = 0;
    return;
  }

  // Clear down mmx registers to allow floating point in what follows

  // Work out how big we would have expected the frame to be at this Q given
  // the current correction factor.
  // Stay in double to avoid int overflow when values are large
  if (cyclic_refresh_active) {
    projected_size_based_on_q =
        av1_cyclic_refresh_estimate_bits_at_q(cpi, rate_correction_factor);
  } else {
    projected_size_based_on_q = av1_estimate_bits_at_q(
        cpi, cm->quant_params.base_qindex, rate_correction_factor);
  }
  // Work out a size correction factor.
  if (projected_size_based_on_q > FRAME_OVERHEAD_BITS)
    correction_factor = (double)cpi->rc.projected_frame_size /
                        (double)projected_size_based_on_q;

  // Clamp correction factor to prevent anything too extreme
  correction_factor = AOMMAX(correction_factor, 0.25);

  cpi->rc.q_2_frame = cpi->rc.q_1_frame;
  cpi->rc.q_1_frame = cm->quant_params.base_qindex;
  cpi->rc.rc_2_frame = cpi->rc.rc_1_frame;
  if (correction_factor > 1.1)
    cpi->rc.rc_1_frame = -1;
  else if (correction_factor < 0.9)
    cpi->rc.rc_1_frame = 1;
  else
    cpi->rc.rc_1_frame = 0;

  // Decide how heavily to dampen the adjustment
  if (correction_factor > 0.0) {
    if (cpi->is_screen_content_type) {
      adjustment_limit =
          0.25 + 0.5 * AOMMIN(0.5, fabs(log10(correction_factor)));
    } else {
      adjustment_limit =
          0.25 + 0.75 * AOMMIN(0.5, fabs(log10(correction_factor)));
    }
  } else {
    adjustment_limit = 0.75;
  }

  // Adjustment to delta Q and number of blocks updated in cyclic refresh
  // based on over or under shoot of target in current frame.
  if (cyclic_refresh_active && cpi->rc.this_frame_target > 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    if (correction_factor > 1.25) {
      cr->percent_refresh_adjustment =
          AOMMAX(cr->percent_refresh_adjustment - 1, -5);
      cr->rate_ratio_qdelta_adjustment =
          AOMMAX(cr->rate_ratio_qdelta_adjustment - 0.05, -0.0);
    } else if (correction_factor < 0.5) {
      cr->percent_refresh_adjustment =
          AOMMIN(cr->percent_refresh_adjustment + 1, 5);
      cr->rate_ratio_qdelta_adjustment =
          AOMMIN(cr->rate_ratio_qdelta_adjustment + 0.05, 0.25);
    }
  }

  if (correction_factor > 1.01) {
    // We are not already at the worst allowable quality
    correction_factor = (1.0 + ((correction_factor - 1.0) * adjustment_limit));
    rate_correction_factor = rate_correction_factor * correction_factor;
    // Keep rate_correction_factor within limits
    if (rate_correction_factor > MAX_BPB_FACTOR)
      rate_correction_factor = MAX_BPB_FACTOR;
  } else if (correction_factor < 0.99) {
    // We are not already at the best allowable quality
    correction_factor = 1.0 / correction_factor;
    correction_factor = (1.0 + ((correction_factor - 1.0) * adjustment_limit));
    correction_factor = 1.0 / correction_factor;

    rate_correction_factor = rate_correction_factor * correction_factor;

    // Keep rate_correction_factor within limits
    if (rate_correction_factor < MIN_BPB_FACTOR)
      rate_correction_factor = MIN_BPB_FACTOR;
  }

  set_rate_correction_factor(cpi, is_encode_stage, rate_correction_factor,
                             width, height);
}